

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

pair<google::dense_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
* __thiscall
google::
dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::insert_noresize<int,int_const&>
          (pair<google::dense_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
           *__return_storage_ptr__,
          dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          *this,int *key,int *args)

{
  long lVar1;
  long lVar2;
  unsigned_long uVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  
  pVar4 = dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>
                    ((dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)this,key);
  uVar3 = pVar4.first;
  if (uVar3 == 0xffffffffffffffff) {
    insert_at<int_const&>(&__return_storage_ptr__->first,this,pVar4.second,args);
  }
  else {
    lVar1 = *(long *)(this + 0x58);
    lVar2 = *(long *)(this + 0x70);
    (__return_storage_ptr__->first).ht =
         (dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)this;
    (__return_storage_ptr__->first).pos = (pointer)(lVar2 + uVar3 * 4);
    (__return_storage_ptr__->first).end = (pointer)(lVar2 + lVar1 * 4);
  }
  __return_storage_ptr__->second = uVar3 == 0xffffffffffffffff;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert_noresize(K&& key, Args&&... args) {
    // First, double-check we're not inserting delkey or emptyval
    assert(settings.use_empty() && "Inserting without empty key");
    assert(!equals(std::forward<K>(key), key_info.empty_key) && "Inserting the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) && "Inserting the deleted key");

    const std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return std::pair<iterator, bool>(
          iterator(this, table + pos.first, table + num_buckets, false),
          false);  // false: we didn't insert
    } else {       // pos.second says where to put it
      return std::pair<iterator, bool>(insert_at(pos.second, std::forward<Args>(args)...), true);
    }
  }